

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
cppqc::detail::ListOfStatelessGenerator<int>::unGen
          (ListOfStatelessGenerator<int> *this,RngEngine *rng,size_t size)

{
  vector<int,_std::allocator<int>_> *in_RDI;
  size_t n;
  uniform_int_distribution<unsigned_long> dist;
  vector<int,_std::allocator<int>_> *ret;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  size_type in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 uVar1;
  undefined8 local_38;
  
  std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_long> *)in_RDI,
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),0x11e407);
  local_38 = std::uniform_int_distribution<unsigned_long>::operator()
                       ((uniform_int_distribution<unsigned_long> *)in_RDI,
                        (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                         *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  uVar1 = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x11e42a);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)CONCAT17(uVar1,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8);
  while (local_38 != 0) {
    in_stack_ffffffffffffff8c =
         StatelessGenerator<int>::unGen
                   ((StatelessGenerator<int> *)in_RDI,
                    (RngEngine *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                    0x11e468);
    std::vector<int,_std::allocator<int>_>::push_back
              (in_RDI,(value_type *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    local_38 = local_38 - 1;
  }
  return in_RDI;
}

Assistant:

std::vector<T> unGen(RngEngine& rng, std::size_t size) const {
    std::uniform_int_distribution<std::size_t> dist{0, size};
    std::size_t n = dist(rng);
    std::vector<T> ret;
    ret.reserve(n);
    while (n-- > 0)
      ret.push_back(m_gen.unGen(rng, size));
    return ret;
  }